

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.cc
# Opt level: O1

collision_table_object_t * __thiscall
tchecker::collision_table_object_t::operator=
          (collision_table_object_t *this,collision_table_object_t *o)

{
  invalid_argument *this_00;
  code *pcVar1;
  undefined *puVar2;
  
  if ((this->_position_in_table == 0xffffffff) || (this->_position_in_collision_list == 0xffffffff))
  {
    if ((o->_position_in_table == 0xffffffff) || (o->_position_in_collision_list == 0xffffffff)) {
      return this;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Cannot move an object that is stored in a collision table");
    puVar2 = &std::invalid_argument::typeinfo;
    pcVar1 = std::invalid_argument::~invalid_argument;
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              ((runtime_error *)this_00,
               "Cannot assign an object that is stored in a collision table");
    puVar2 = &std::runtime_error::typeinfo;
    pcVar1 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar2,pcVar1);
}

Assistant:

bool collision_table_object_t::is_stored() const
{
  return (_position_in_table != tchecker::COLLISION_TABLE_NOT_STORED &&
          _position_in_collision_list != tchecker::COLLISION_TABLE_NOT_STORED);
}